

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int imcomp_calc_max_elem(int comptype,int nx,int zbitpix,int blocksize)

{
  double dVar1;
  
  if (comptype == 0xb) {
    if (zbitpix == 0x10) {
      return nx / blocksize + nx * 2 + 6;
    }
    return nx / blocksize + nx * 4 + 6;
  }
  if (comptype - 0x15U < 2) {
    if (zbitpix == 8) {
      return nx;
    }
    if (zbitpix == 0x10) {
      return nx * 2;
    }
  }
  else {
    if (comptype == 0x29) {
      if ((zbitpix == 0x10) || (zbitpix == 8)) {
        dVar1 = (double)nx * 2.2;
      }
      else {
        dVar1 = (double)nx * 4.4;
      }
      return (int)(dVar1 + 26.0);
    }
    if (comptype == 0x33) {
      return (int)((double)zbitpix * (double)nx * 1.01 * 0.125 + 601.0);
    }
  }
  return nx << 2;
}

Assistant:

int imcomp_calc_max_elem (int comptype, int nx, int zbitpix, int blocksize)

/* This function returns the maximum number of bytes in a compressed
   image line.

    nx = maximum number of pixels in a tile
    blocksize is only relevant for RICE compression
*/
{    
    if (comptype == RICE_1)
    {
        if (zbitpix == 16)
            return (sizeof(short) * nx + nx / blocksize + 2 + 4);
	else
            return (sizeof(float) * nx + nx / blocksize + 2 + 4);
    }
    else if ((comptype == GZIP_1) || (comptype == GZIP_2))
    {
        /* gzip usually compressed by at least a factor of 2 for I*4 images */
        /* and somewhat less for I*2 images */
        /* If this size turns out to be too small, then the gzip */
        /* compression routine will allocate more space as required */
        /* to be on the safe size, allocate buffer same size as input */
	
        if (zbitpix == 16)
            return(nx * 2);
	else if (zbitpix == 8)
            return(nx);
	else
            return(nx * 4);
    }
    else if (comptype == BZIP2_1)
    {
        /* To guarantee that the compressed data will fit, allocate an output
	   buffer of size 1% larger than the uncompressed data, plus 600 bytes */

            return((int) (nx * 1.01 * zbitpix / 8. + 601.));
    }
     else if (comptype == HCOMPRESS_1)
    {
        /* Imperical evidence suggests in the worst case, 
	   the compressed stream could be up to 10% larger than the original
	   image.  Add 26 byte overhead, only significant for very small tiles
	   
         Possible improvement: may need to allow a larger size for 32-bit images */

        if (zbitpix == 16 || zbitpix == 8)
	
            return( (int) (nx * 2.2 + 26));   /* will be compressing 16-bit int array */
        else
            return( (int) (nx * 4.4 + 26));   /* will be compressing 32-bit int array */
    }
    else
        return(nx * sizeof(int));
}